

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boss.cpp
# Opt level: O0

void __thiscall
Boss::Boss(Boss *this,string *id,string *name,Address *add,int hw,int sph,int wtd,int wd,
          int numberOfEmployees)

{
  Address local_e0;
  string local_70 [32];
  string local_50 [32];
  int local_30;
  int local_2c;
  int sph_local;
  int hw_local;
  Address *add_local;
  string *name_local;
  string *id_local;
  Boss *this_local;
  
  local_30 = sph;
  local_2c = hw;
  _sph_local = add;
  add_local = (Address *)name;
  name_local = id;
  id_local = (string *)this;
  std::__cxx11::string::string(local_50,(string *)id);
  std::__cxx11::string::string(local_70,(string *)add_local);
  Address::Address(&local_e0,_sph_local);
  Employee::Employee(&this->super_Employee,(string *)local_50,(string *)local_70,&local_e0,local_2c,
                     local_30,wtd,wd);
  Address::~Address(&local_e0);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  (this->super_Employee).super_Person._vptr_Person = (_func_int **)&PTR_operator__0010ad88;
  this->numberOfEmployees = numberOfEmployees;
  return;
}

Assistant:

Boss::Boss(const std::string &id, const std::string &name, const Address &add, int hw, int sph, int wtd, int wd,
           int numberOfEmployees) : Employee(id, name, add, hw, sph, wtd, wd), numberOfEmployees(numberOfEmployees) {}